

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O0

void FunctionalTester<long_long,_void>::Test(void)

{
  longlong lVar1;
  char *pcVar2;
  char local_98 [8];
  char buf2 [64];
  char buf1 [64];
  TestWatcher<long_long> local_9 [8];
  TestWatcher<long_long> tw;
  
  TestWatcher<long_long>::TestWatcher(local_9);
  lVar1 = std::numeric_limits<long_long>::min();
  int2str::convert_with_zero<long_long,char*>(lVar1,buf2 + 0x38);
  pcVar2 = PrintfFormat<long_long>();
  lVar1 = std::numeric_limits<long_long>::min();
  sprintf(local_98,pcVar2,lVar1);
  StrcmpAndExit(buf2 + 0x38,local_98);
  lVar1 = std::numeric_limits<long_long>::max();
  int2str::convert_with_zero<long_long,char*>(lVar1,buf2 + 0x38);
  pcVar2 = PrintfFormat<long_long>();
  lVar1 = std::numeric_limits<long_long>::max();
  sprintf(local_98,pcVar2,lVar1);
  StrcmpAndExit(buf2 + 0x38,local_98);
  TestWatcher<long_long>::~TestWatcher(local_9);
  return;
}

Assistant:

static void Test()
    {
        TestWatcher<T> const tw;
        char buf1[64];
        char buf2[64];
        int2str::convert_with_zero(std::numeric_limits<T>::min(), buf1);
        sprintf(buf2, PrintfFormat<T>(), std::numeric_limits<T>::min());
        StrcmpAndExit(buf1, buf2);
        int2str::convert_with_zero(std::numeric_limits<T>::max(), buf1);
        sprintf(buf2, PrintfFormat<T>(), std::numeric_limits<T>::max());
        StrcmpAndExit(buf1, buf2);
    }